

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Oscilloscope.cpp
# Opt level: O2

int Oscilloscope::GetFloatBufferCallback
              (UnityAudioEffectState *state,char *name,float *buffer,int numsamples)

{
  bool bVar1;
  EffectData *pEVar2;
  int numsamplesSource;
  
  pEVar2 = UnityAudioEffectState::GetEffectData<Oscilloscope::EffectData>(state);
  bVar1 = 1.0 <= pEVar2->p[2];
  numsamplesSource = 0x1000;
  if (!bVar1) {
    numsamplesSource = numsamples;
  }
  HistoryBuffer::ReadBuffer
            ((HistoryBuffer *)((long)pEVar2 + (long)name[7] * 0x10 + (ulong)bVar1 * 0x80 + -0x2f0),
             buffer,numsamples,numsamplesSource,0.0);
  return 0;
}

Assistant:

int UNITY_AUDIODSP_CALLBACK GetFloatBufferCallback(UnityAudioEffectState* state, const char* name, float* buffer, int numsamples)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        int channel = name[7] - '0';
        if (data->p[P_Mode] >= 1.0f)
            data->spectrum[channel].ReadBuffer(buffer, numsamples, FFTSIZE / 2, 0.0f);
        else
            data->history[channel].ReadBuffer(buffer, numsamples, numsamples, 0.0f);
        return UNITY_AUDIODSP_OK;
    }